

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicPred_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicPred_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  int in_stack_fffffffffffff798;
  AssertionHelper local_7c0;
  Fixed local_790;
  undefined1 local_608 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_5d8 [4];
  int x_3;
  Fixed local_5a8;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_3f0 [4];
  int x_2;
  Fixed local_3c0;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  int x_1;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x;
  iu_SyntaxTest_x_iutest_x_VariadicPred_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
            ((AssertionResult *)local_40,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",(char *)PredTest6,
             (_func_bool_int_int_int_int_int_int *)0x0,iutest_ar._36_4_,2,3,4,5,
             in_stack_fffffffffffff798);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&x_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x319,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&x_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_238,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,iutest_ar_1._32_4_,2,3,4,
               5,in_stack_fffffffffffff798);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3c0,iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_3f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x31b,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_3f0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_3f0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest_ar_2._36_4_ = 1;
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_420,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,iutest_ar_2._36_4_,2,3,4,
               5,in_stack_fffffffffffff798);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5a8,iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x31d,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_5d8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_5d8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    iutest_ar_3._36_4_ = 1;
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_608,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,iutest_ar_3._36_4_,2,3,4,
               5,in_stack_fffffffffffff798);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
    if (!bVar1) {
      memset(&local_790,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_790);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_790,iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_608);
      iutest::AssertionHelper::AssertionHelper
                (&local_7c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,799,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7c0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7c0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_790);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicPred)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
}